

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O3

void __thiscall
chrono::ChLoaderUVWdistributed::ChLoaderUVWdistributed
          (ChLoaderUVWdistributed *this,shared_ptr<chrono::ChLoadableUVW> *mloadable)

{
  ChVectorDynamic<> *pCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  
  peVar2 = (mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  this_00 = (mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_ChLoaderUVW).super_ChLoader.Q.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    (this->super_ChLoaderUVW).super_ChLoader.Q.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    (this->super_ChLoaderUVW).loadable.
    super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->super_ChLoaderUVW).loadable.
    super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00697155;
  }
  pCVar1 = &(this->super_ChLoaderUVW).super_ChLoader.Q;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar3 = __libc_single_threaded != '\0';
    (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)0x0;
    (this->super_ChLoaderUVW).super_ChLoader.Q.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    (this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader =
         (_func_int **)&PTR__ChLoaderUVW_00b2ae50;
    (this->super_ChLoaderUVW).loadable.
    super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->super_ChLoaderUVW).loadable.
    super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_00;
    if (bVar3) goto LAB_0069714d;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)0x0;
    (this->super_ChLoaderUVW).super_ChLoader.Q.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    (this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader =
         (_func_int **)&PTR__ChLoaderUVW_00b2ae50;
    (this->super_ChLoaderUVW).loadable.
    super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (this->super_ChLoaderUVW).loadable.
    super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_00;
LAB_0069714d:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_00697155:
  (this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader = (_func_int **)&PTR__ChLoaderUVW_00b33c78
  ;
  return;
}

Assistant:

ChLoaderUVWdistributed(std::shared_ptr<ChLoadableUVW> mloadable) : ChLoaderUVW(mloadable) {}